

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void gen_addiupc(DisasContext_conflict6 *ctx,int rx,int imm,int is_64_bit,int extended)

{
  TCGContext_conflict6 *tcg_ctx;
  TCGv_i64 ret;
  target_ulong arg;
  uintptr_t o;
  
  tcg_ctx = ctx->uc->tcg_ctx;
  if ((extended != 0) && ((ctx->hflags & 0x87f800) != 0)) {
    generate_exception_end(ctx,0x14);
    return;
  }
  ret = tcg_temp_new_i64(tcg_ctx);
  arg = pc_relative_pc(ctx);
  tcg_gen_movi_i64_mips64el(tcg_ctx,ret,arg);
  tcg_gen_addi_i64_mips64el(tcg_ctx,tcg_ctx->cpu_gpr[rx],ret,(long)imm);
  if (is_64_bit == 0) {
    tcg_gen_ext32s_i64_mips64el(tcg_ctx,tcg_ctx->cpu_gpr[rx],tcg_ctx->cpu_gpr[rx]);
  }
  tcg_temp_free_internal_mips64el(tcg_ctx,(TCGTemp *)(ret + (long)tcg_ctx));
  return;
}

Assistant:

static void gen_addiupc(DisasContext *ctx, int rx, int imm,
                        int is_64_bit, int extended)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv t0;

    if (extended && (ctx->hflags & MIPS_HFLAG_BMASK)) {
        generate_exception_end(ctx, EXCP_RI);
        return;
    }

    t0 = tcg_temp_new(tcg_ctx);

    tcg_gen_movi_tl(tcg_ctx, t0, pc_relative_pc(ctx));
    tcg_gen_addi_tl(tcg_ctx, tcg_ctx->cpu_gpr[rx], t0, imm);
    if (!is_64_bit) {
        tcg_gen_ext32s_tl(tcg_ctx, tcg_ctx->cpu_gpr[rx], tcg_ctx->cpu_gpr[rx]);
    }

    tcg_temp_free(tcg_ctx, t0);
}